

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::escape_ml_basic_string
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,string_type *s)

{
  byte __c;
  pointer pcVar1;
  size_type sVar2;
  char cVar3;
  size_type __pos;
  uint *puVar4;
  string_type *extraout_RDX;
  string_type *extraout_RDX_00;
  string_type *extraout_RDX_01;
  char (*extraout_RDX_02) [5];
  char (*s_00) [5];
  char (*s_01) [4];
  char (*extraout_RDX_03) [5];
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  serializer<toml::type_config> *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  sVar5 = 0;
  local_38 = this;
  do {
    if (sVar2 == sVar5) {
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<4ul>(&bStack_58,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)"\"\"\"",(char (*) [4])s);
      __pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58,0
                  );
      std::__cxx11::string::~string((string *)&bStack_58);
      s_00 = extraout_RDX_02;
      while (__pos != 0xffffffffffffffff) {
        string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
        ::invoke<5ul>(&bStack_58,
                      (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                       *)"\"\"\\\"",s_00);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,__pos,3,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58);
        std::__cxx11::string::~string((string *)&bStack_58);
        string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
        ::invoke<4ul>(&bStack_58,
                      (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                       *)"\"\"\"",s_01);
        __pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bStack_58,0);
        std::__cxx11::string::~string((string *)&bStack_58);
        s_00 = extraout_RDX_03;
      }
      return __return_storage_ptr__;
    }
    __c = pcVar1[sVar5];
    puVar4 = &switchD_0032d73d::switchdataD_0037e2a8;
    switch(__c) {
    case 8:
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<3ul>(&bStack_58,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)0x37b270,(char (*) [3])&switchD_0032d73d::switchdataD_0037e2a8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58);
      break;
    case 9:
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<3ul>(&bStack_58,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)0x37ed3b,(char (*) [3])&switchD_0032d73d::switchdataD_0037e2a8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58);
      break;
    case 10:
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<2ul>(&bStack_58,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)0x3820b7,(char (*) [2])&switchD_0032d73d::switchdataD_0037e2a8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58);
      break;
    case 0xb:
switchD_0032d73d_caseD_b:
      if (__c < 9) {
LAB_0032d857:
        if ((local_38->spec_).v1_1_0_add_escape_sequence_x == true) {
          string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
          ::invoke<3ul>(&bStack_58,
                        (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                         *)"\\x",(char (*) [3])puVar4);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58);
        }
        else {
          string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
          ::invoke<5ul>(&bStack_58,
                        (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                         *)"\\u00",(char (*) [5])puVar4);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58);
        }
        std::__cxx11::string::~string((string *)&bStack_58);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,__c >> 4 | 0x30);
        cVar3 = '0';
        if (9 < (__c & 0xf)) {
          cVar3 = '7';
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(__c & 0xf) + cVar3);
        s = extraout_RDX_00;
      }
      else {
LAB_0032d83f:
        if (__c == 0x7f || (byte)(__c - 10) < 0x16) goto LAB_0032d857;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,__c);
        s = extraout_RDX_01;
      }
      goto LAB_0032d837;
    case 0xc:
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<3ul>(&bStack_58,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)0x37b3a2,(char (*) [3])&switchD_0032d73d::switchdataD_0037e2a8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58);
      break;
    case 0xd:
      string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
      ::invoke<3ul>(&bStack_58,
                    (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                     *)0x37b3f0,(char (*) [3])&switchD_0032d73d::switchdataD_0037e2a8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58);
      break;
    default:
      puVar4 = (uint *)s;
      if (__c == 0x1b) {
        if ((local_38->spec_).v1_1_0_add_escape_sequence_e != true) goto LAB_0032d83f;
        string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
        ::invoke<3ul>(&bStack_58,
                      (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                       *)0x37ed40,(char (*) [3])s);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58);
      }
      else {
        if (__c != 0x5c) goto switchD_0032d73d_caseD_b;
        string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
        ::invoke<3ul>(&bStack_58,
                      (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                       *)"\\\\",(char (*) [3])s);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bStack_58);
      }
    }
    std::__cxx11::string::~string((string *)&bStack_58);
    s = extraout_RDX;
LAB_0032d837:
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

string_type escape_ml_basic_string(const string_type& s) // {{{
    {
        string_type retval;
        for(const char_type c : s)
        {
            switch(c)
            {
                case char_type('\\'): {retval += string_conv<string_type>("\\\\"); break;}
                case char_type('\b'): {retval += string_conv<string_type>("\\b" ); break;}
                case char_type('\t'): {retval += string_conv<string_type>("\\t" ); break;}
                case char_type('\f'): {retval += string_conv<string_type>("\\f" ); break;}
                case char_type('\n'): {retval += string_conv<string_type>("\n"  ); break;}
                case char_type('\r'): {retval += string_conv<string_type>("\\r" ); break;}
                default  :
                {
                    if(c == char_type(0x1B) && spec_.v1_1_0_add_escape_sequence_e)
                    {
                        retval += string_conv<string_type>("\\e");
                    }
                    else if((char_type(0x00) <= c && c <= char_type(0x08)) ||
                            (char_type(0x0A) <= c && c <= char_type(0x1F)) ||
                            c == char_type(0x7F))
                    {
                        if(spec_.v1_1_0_add_escape_sequence_x)
                        {
                            retval += string_conv<string_type>("\\x");
                        }
                        else
                        {
                            retval += string_conv<string_type>("\\u00");
                        }
                        const auto c1 = c / 16;
                        const auto c2 = c % 16;
                        retval += static_cast<char_type>('0' + c1);
                        if(c2 < 10)
                        {
                            retval += static_cast<char_type>('0' + c2);
                        }
                        else // 10 <= c2
                        {
                            retval += static_cast<char_type>('A' + (c2 - 10));
                        }
                    }
                    else
                    {
                        retval += c;
                    }
                }
            }
        }
        // Only 1 or 2 consecutive `"`s are allowed in multiline basic string.
        // 3 consecutive `"`s are considered as a closing delimiter.
        // We need to check if there are 3 or more consecutive `"`s and insert
        // backslash to break them down into several short `"`s like the `str6`
        // in the following example.
        // ```toml
        // str4 = """Here are two quotation marks: "". Simple enough."""
        // # str5 = """Here are three quotation marks: """."""  # INVALID
        // str5 = """Here are three quotation marks: ""\"."""
        // str6 = """Here are fifteen quotation marks: ""\"""\"""\"""\"""\"."""
        // ```
        auto found_3_quotes = retval.find(string_conv<string_type>("\"\"\""));
        while(found_3_quotes != string_type::npos)
        {
            retval.replace(found_3_quotes, 3, string_conv<string_type>("\"\"\\\""));
            found_3_quotes = retval.find(string_conv<string_type>("\"\"\""));
        }
        return retval;
    }